

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int GetRawDataublox(UBLOX *publox,uchar *buf,int buflen,int *pReceivedBytes)

{
  int iVar1;
  
  iVar1 = ReadRS232Port(&publox->RS232Port,buf,buflen,pReceivedBytes);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(buf,(long)*pReceivedBytes,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
  }
  else {
    puts("Error reading data from a ublox. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetRawDataublox(UBLOX* publox, unsigned char* buf, int buflen, int* pReceivedBytes)
{
	if (ReadRS232Port(&publox->RS232Port, buf, buflen, pReceivedBytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(buf, *pReceivedBytes, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	return EXIT_SUCCESS;
}